

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

bool QUtil::file_can_be_opened(char *filename)

{
  FILE *__stream;
  
  __stream = (FILE *)safe_fopen(filename,"rb");
  fclose(__stream);
  return true;
}

Assistant:

bool
QUtil::file_can_be_opened(char const* filename)
{
    try {
        fclose(safe_fopen(filename, "rb"));
        return true;
    } catch (std::runtime_error&) {
        // can't open the file
    }
    return false;
}